

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O0

int parse_auxv_contents(void)

{
  bool bVar1;
  int __fd;
  ssize_t sVar2;
  int *piVar3;
  int local_1064;
  long *local_1060;
  Elf64_auxv_t *a;
  Elf64_auxv_t *auxv;
  ssize_t result;
  ssize_t offset;
  ssize_t buffer_size;
  char buffer [4096];
  int done;
  int fd;
  char name [16];
  int local_c;
  
  done._0_1_ = '/';
  done._1_1_ = 'p';
  done._2_1_ = 'r';
  done._3_1_ = 'o';
  fd._0_1_ = 'c';
  fd._1_1_ = '/';
  fd._2_1_ = 's';
  fd._3_1_ = 'e';
  builtin_strncpy(name,"lf/auxv",8);
  bVar1 = false;
  memset(&buffer_size,0,0x1000);
  result = 0;
  if (parse_auxv_contents::parsed_auxv == 0) {
    parse_auxv_contents::parsed_auxv = 1;
    __fd = open((char *)&done,0);
    if (__fd == -1) {
      parse_auxv_contents::parsed_auxv = -1;
      local_c = -1;
    }
    else {
      do {
        while( true ) {
          while (sVar2 = read(__fd,buffer + result + -8,0x1000 - result), sVar2 == -1) {
            piVar3 = __errno_location();
            if (*piVar3 != 4) {
              close(__fd);
              parse_auxv_contents::parsed_auxv = -1;
              return -1;
            }
          }
          if (sVar2 == 0) break;
          if (result == 0x1000) goto LAB_00485c6c;
          result = sVar2 + result;
        }
        close(__fd);
        bVar1 = true;
LAB_00485c6c:
        for (local_1060 = &buffer_size; *local_1060 != 0; local_1060 = local_1060 + 2) {
          if (*local_1060 == 0x21) {
            vdso_ehdr = (Elf64_Ehdr *)local_1060[1];
          }
          else if (*local_1060 == 6) {
            auxv_pagesz = (uint)local_1060[1];
          }
        }
      } while (!bVar1);
      local_c = 0;
    }
  }
  else {
    if (parse_auxv_contents::parsed_auxv == -1) {
      local_1064 = parse_auxv_contents::parsed_auxv;
    }
    else {
      local_1064 = 0;
    }
    local_c = local_1064;
  }
  return local_c;
}

Assistant:

int parse_auxv_contents() {
  char name[] = "/proc/self/auxv";
  int fd = -1, done = 0;
  char buffer[BUFFER_LEN] = {'\0'};
  const ssize_t buffer_size = BUFFER_LEN;
  ssize_t offset = 0, result = 0;
  ElfW(auxv_t) *auxv = NULL, *a = NULL;
  static int parsed_auxv = 0;

  if (parsed_auxv) return parsed_auxv == -1 ? parsed_auxv : 0;
  parsed_auxv = 1;

  fd = gotcha_open(name, O_RDONLY);
  if (fd == -1) {
    parsed_auxv = -1;  // GCOVR_EXCL_LINE
    return -1;         // GCOVR_EXCL_LINE
  }

  do {
    for (;;) {
      result = gotcha_read(fd, buffer + offset, buffer_size - offset);
      if (result == -1) {
        if (errno == EINTR)  // GCOVR_EXCL_START
          continue;
        gotcha_close(fd);
        parsed_auxv = -1;
        return -1;
      }  // GCOVR_EXCL_STOP
      if (result == 0) {
        gotcha_close(fd);
        done = 1;
        break;
      }
      if (offset == buffer_size) {
        break;  // GCOVR_EXCL_LINE
      }
      offset += result;
    }

    auxv = (ElfW(auxv_t) *)buffer;
    for (a = auxv; a->a_type != AT_NULL; a++) {
      if (a->a_type == AT_SYSINFO_EHDR) {
        vdso_ehdr = (ElfW(Ehdr) *)a->a_un.a_val;
      } else if (a->a_type == AT_PAGESZ) {
        auxv_pagesz = (int)a->a_un.a_val;
      }
    }
  } while (!done);

  return 0;
}